

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O0

FSerializer * Serialize(FSerializer *arc,char *key,uint16_t *value,uint16_t *defval)

{
  uint local_34;
  uint local_30;
  uint local_2c;
  uint32_t vvd;
  uint32_t vv;
  uint16_t *defval_local;
  uint16_t *value_local;
  char *key_local;
  FSerializer *arc_local;
  
  local_2c = (uint)*value;
  if (defval == (uint16_t *)0x0) {
    local_34 = *value - 1;
  }
  else {
    local_34 = (uint)*defval;
  }
  local_30 = local_34;
  _vvd = defval;
  defval_local = value;
  value_local = (uint16_t *)key;
  key_local = (char *)arc;
  Serialize(arc,key,&local_2c,&local_30);
  *defval_local = (uint16_t)local_2c;
  return (FSerializer *)key_local;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, uint16_t &value, uint16_t *defval)
{
	uint32_t vv = value;
	uint32_t vvd = defval ? *defval : value - 1;
	Serialize(arc, key, vv, &vvd);
	value = (uint16_t)vv;
	return arc;
}